

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O0

CURLcode cf_socket_open(Curl_cfilter *cf,Curl_easy *data)

{
  curl_socket_t sockfd;
  void *pvVar1;
  connectdata *conn;
  bool bVar2;
  int iVar3;
  uint scope;
  bool bVar4;
  curltime cVar5;
  undefined4 uStack_44;
  undefined4 uStack_34;
  CURLcode local_2c;
  _Bool is_tcp;
  CURLcode result;
  _Bool isconnected;
  int error;
  cf_socket_ctx *ctx;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  pvVar1 = cf->ctx;
  bVar2 = false;
  cVar5 = Curl_now();
  *(time_t *)((long)pvVar1 + 0x148) = cVar5.tv_sec;
  *(ulong *)((long)pvVar1 + 0x150) = CONCAT44(uStack_34,cVar5.tv_usec);
  local_2c = socket_open(data,(Curl_sockaddr_ex *)((long)pvVar1 + 8),
                         (curl_socket_t *)((long)pvVar1 + 0x98));
  if ((local_2c == CURLE_OK) && (local_2c = set_remote_ip(cf,data), local_2c == CURLE_OK)) {
    if (*(int *)((long)pvVar1 + 8) == 10) {
      if ((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) {
        Curl_infof(data,"  Trying [%s]:%d...",(long)pvVar1 + 0xe0,
                   (ulong)*(uint *)((long)pvVar1 + 0x110));
      }
    }
    else if ((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0))
    {
      Curl_infof(data,"  Trying %s:%d...",(long)pvVar1 + 0xe0,(ulong)*(uint *)((long)pvVar1 + 0x110)
                );
    }
    if ((*(int *)((long)pvVar1 + 8) == 2) || (bVar4 = false, *(int *)((long)pvVar1 + 8) == 10)) {
      bVar4 = *(int *)((long)pvVar1 + 0xc) == 1;
    }
    if ((bVar4) && ((*(ulong *)&(data->set).field_0x8ba >> 0x21 & 1) != 0)) {
      tcpnodelay(data,*(curl_socket_t *)((long)pvVar1 + 0x98));
    }
    if ((bVar4) && ((*(ulong *)&(data->set).field_0x8ba >> 0x27 & 1) != 0)) {
      tcpkeepalive(data,*(curl_socket_t *)((long)pvVar1 + 0x98));
    }
    if ((data->set).fsockopt != (curl_sockopt_callback)0x0) {
      Curl_set_in_callback(data,true);
      iVar3 = (*(data->set).fsockopt)
                        ((data->set).sockopt_client,*(curl_socket_t *)((long)pvVar1 + 0x98),
                         CURLSOCKTYPE_IPCXN);
      Curl_set_in_callback(data,false);
      if (iVar3 == 2) {
        bVar2 = true;
      }
      else if (iVar3 != 0) {
        local_2c = CURLE_ABORTED_BY_CALLBACK;
        goto LAB_00c28005;
      }
    }
    if ((*(int *)((long)pvVar1 + 8) == 2) || (*(int *)((long)pvVar1 + 8) == 10)) {
      conn = cf->conn;
      sockfd = *(curl_socket_t *)((long)pvVar1 + 0x98);
      iVar3 = *(int *)((long)pvVar1 + 8);
      scope = Curl_ipv6_scope((sockaddr *)((long)pvVar1 + 0x18));
      local_2c = bindlocal(data,conn,sockfd,iVar3,scope);
      if (local_2c != CURLE_OK) {
        if (local_2c == CURLE_UNSUPPORTED_PROTOCOL) {
          local_2c = CURLE_COULDNT_CONNECT;
        }
        goto LAB_00c28005;
      }
    }
    curlx_nonblock(*(curl_socket_t *)((long)pvVar1 + 0x98),1);
    *(byte *)((long)pvVar1 + 0x17c) =
         *(byte *)((long)pvVar1 + 0x17c) & 0xfb | (*(int *)((long)pvVar1 + 0xc) != 2) << 2;
  }
LAB_00c28005:
  if (local_2c == CURLE_OK) {
    if (bVar2) {
      set_local_ip(cf,data);
      cVar5 = Curl_now();
      *(time_t *)((long)pvVar1 + 0x158) = cVar5.tv_sec;
      *(ulong *)((long)pvVar1 + 0x160) = CONCAT44(uStack_44,cVar5.tv_usec);
      cf->field_0x24 = cf->field_0x24 & 0xfe | 1;
    }
  }
  else if (*(int *)((long)pvVar1 + 0x98) != -1) {
    socket_close(data,cf->conn,1,*(curl_socket_t *)((long)pvVar1 + 0x98));
    *(undefined4 *)((long)pvVar1 + 0x98) = 0xffffffff;
  }
  if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) &&
      (cf != (Curl_cfilter *)0x0)) && (0 < cf->cft->log_level)) {
    Curl_trc_cf_infof(data,cf,"cf_socket_open() -> %d, fd=%d",(ulong)local_2c,
                      (ulong)*(uint *)((long)pvVar1 + 0x98));
  }
  return local_2c;
}

Assistant:

static CURLcode cf_socket_open(struct Curl_cfilter *cf,
                              struct Curl_easy *data)
{
  struct cf_socket_ctx *ctx = cf->ctx;
  int error = 0;
  bool isconnected = FALSE;
  CURLcode result = CURLE_COULDNT_CONNECT;
  bool is_tcp;

  (void)data;
  DEBUGASSERT(ctx->sock == CURL_SOCKET_BAD);
  ctx->started_at = Curl_now();
  result = socket_open(data, &ctx->addr, &ctx->sock);
  if(result)
    goto out;

  result = set_remote_ip(cf, data);
  if(result)
    goto out;

#ifdef ENABLE_IPV6
  if(ctx->addr.family == AF_INET6) {
    set_ipv6_v6only(ctx->sock, 0);
    infof(data, "  Trying [%s]:%d...", ctx->r_ip, ctx->r_port);
  }
  else
#endif
    infof(data, "  Trying %s:%d...", ctx->r_ip, ctx->r_port);

#ifdef ENABLE_IPV6
  is_tcp = (ctx->addr.family == AF_INET
            || ctx->addr.family == AF_INET6) &&
           ctx->addr.socktype == SOCK_STREAM;
#else
  is_tcp = (ctx->addr.family == AF_INET) &&
           ctx->addr.socktype == SOCK_STREAM;
#endif
  if(is_tcp && data->set.tcp_nodelay)
    tcpnodelay(data, ctx->sock);

  nosigpipe(data, ctx->sock);

  Curl_sndbufset(ctx->sock);

  if(is_tcp && data->set.tcp_keepalive)
    tcpkeepalive(data, ctx->sock);

  if(data->set.fsockopt) {
    /* activate callback for setting socket options */
    Curl_set_in_callback(data, true);
    error = data->set.fsockopt(data->set.sockopt_client,
                               ctx->sock,
                               CURLSOCKTYPE_IPCXN);
    Curl_set_in_callback(data, false);

    if(error == CURL_SOCKOPT_ALREADY_CONNECTED)
      isconnected = TRUE;
    else if(error) {
      result = CURLE_ABORTED_BY_CALLBACK;
      goto out;
    }
  }

#ifndef CURL_DISABLE_BINDLOCAL
  /* possibly bind the local end to an IP, interface or port */
  if(ctx->addr.family == AF_INET
#ifdef ENABLE_IPV6
     || ctx->addr.family == AF_INET6
#endif
    ) {
    result = bindlocal(data, cf->conn, ctx->sock, ctx->addr.family,
                       Curl_ipv6_scope(&ctx->addr.sa_addr));
    if(result) {
      if(result == CURLE_UNSUPPORTED_PROTOCOL) {
        /* The address family is not supported on this interface.
           We can continue trying addresses */
        result = CURLE_COULDNT_CONNECT;
      }
      goto out;
    }
  }
#endif

  /* set socket non-blocking */
  (void)curlx_nonblock(ctx->sock, TRUE);
  ctx->sock_connected = (ctx->addr.socktype != SOCK_DGRAM);
out:
  if(result) {
    if(ctx->sock != CURL_SOCKET_BAD) {
      socket_close(data, cf->conn, TRUE, ctx->sock);
      ctx->sock = CURL_SOCKET_BAD;
    }
  }
  else if(isconnected) {
    set_local_ip(cf, data);
    ctx->connected_at = Curl_now();
    cf->connected = TRUE;
  }
  CURL_TRC_CF(data, cf, "cf_socket_open() -> %d, fd=%" CURL_FORMAT_SOCKET_T,
              result, ctx->sock);
  return result;
}